

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::emit_subgroup_op(CompilerMSL *this,Instruction *i)

{
  Scope SVar1;
  Scope SVar2;
  Scope result_id;
  Scope result_type_00;
  bool bVar3;
  uint32_t uVar4;
  CompilerError *pCVar5;
  char *local_b50;
  char *local_b38;
  char *local_b20;
  char *local_b08;
  char *local_ae0;
  allocator local_a51;
  string local_a50 [39];
  bool local_a29;
  uint32_t local_a28;
  uint32_t local_a24;
  uint local_a20;
  uint32_t mask_id;
  uint32_t mask;
  undefined1 local_9f2;
  allocator local_9f1;
  string local_9f0 [32];
  uint32_t local_9d0;
  undefined1 local_9ca;
  allocator local_9c9;
  uint32_t cluster_size_15;
  undefined1 local_9a2;
  allocator local_9a1;
  string local_9a0 [32];
  Scope local_980;
  undefined1 local_97a;
  allocator local_979;
  GroupOperation operation_16;
  undefined1 local_952;
  allocator local_951;
  string local_950 [32];
  uint32_t local_930;
  undefined1 local_92a;
  allocator local_929;
  uint32_t cluster_size_14;
  undefined1 local_902;
  allocator local_901;
  string local_900 [32];
  Scope local_8e0;
  undefined1 local_8da;
  allocator local_8d9;
  GroupOperation operation_15;
  undefined1 local_8b2;
  allocator local_8b1;
  string local_8b0 [32];
  uint32_t local_890;
  undefined1 local_88a;
  allocator local_889;
  uint32_t cluster_size_13;
  undefined1 local_862;
  allocator local_861;
  string local_860 [32];
  Scope local_840;
  undefined1 local_83a;
  allocator local_839;
  GroupOperation operation_14;
  undefined1 local_812;
  allocator local_811;
  string local_810 [32];
  uint32_t local_7f0;
  undefined1 local_7ea;
  allocator local_7e9;
  uint32_t cluster_size_12;
  undefined1 local_7c2;
  allocator local_7c1;
  string local_7c0 [32];
  Scope local_7a0;
  undefined1 local_79a;
  allocator local_799;
  GroupOperation operation_13;
  undefined1 local_772;
  allocator local_771;
  string local_770 [32];
  uint32_t local_750;
  undefined1 local_74a;
  allocator local_749;
  uint32_t cluster_size_11;
  undefined1 local_722;
  allocator local_721;
  string local_720 [32];
  Scope local_700;
  undefined1 local_6fa;
  allocator local_6f9;
  GroupOperation operation_12;
  undefined1 local_6d2;
  allocator local_6d1;
  string local_6d0 [32];
  uint32_t local_6b0;
  undefined1 local_6aa;
  allocator local_6a9;
  uint32_t cluster_size_10;
  undefined1 local_682;
  allocator local_681;
  string local_680 [32];
  Scope local_660;
  undefined1 local_65a;
  allocator local_659;
  GroupOperation operation_11;
  undefined1 local_632;
  allocator local_631;
  string local_630 [32];
  uint32_t local_610;
  undefined1 local_60a;
  allocator local_609;
  uint32_t cluster_size_9;
  undefined1 local_5e2;
  allocator local_5e1;
  string local_5e0 [32];
  Scope local_5c0;
  undefined1 local_5ba;
  allocator local_5b9;
  GroupOperation operation_10;
  undefined1 local_592;
  allocator local_591;
  string local_590 [32];
  uint32_t local_570;
  undefined1 local_56a;
  allocator local_569;
  uint32_t cluster_size_8;
  undefined1 local_542;
  allocator local_541;
  string local_540 [32];
  Scope local_520;
  undefined1 local_51a;
  allocator local_519;
  GroupOperation operation_9;
  undefined1 local_4f2;
  allocator local_4f1;
  string local_4f0 [32];
  uint32_t local_4d0;
  undefined1 local_4ca;
  allocator local_4c9;
  uint32_t cluster_size_7;
  undefined1 local_4a2;
  allocator local_4a1;
  string local_4a0 [32];
  Scope local_480;
  undefined1 local_47a;
  allocator local_479;
  GroupOperation operation_8;
  undefined1 local_452;
  allocator local_451;
  string local_450 [32];
  uint32_t local_430;
  undefined1 local_42a;
  allocator local_429;
  uint32_t cluster_size_6;
  undefined1 local_402;
  allocator local_401;
  string local_400 [32];
  Scope local_3e0;
  undefined1 local_3da;
  allocator local_3d9;
  GroupOperation operation_7;
  undefined1 local_3b2;
  allocator local_3b1;
  string local_3b0 [32];
  uint32_t local_390;
  undefined1 local_38a;
  allocator local_389;
  uint32_t cluster_size_5;
  undefined1 local_362;
  allocator local_361;
  string local_360 [32];
  Scope local_340;
  undefined1 local_33a;
  allocator local_339;
  GroupOperation operation_6;
  undefined1 local_312;
  allocator local_311;
  string local_310 [32];
  uint32_t local_2f0;
  undefined1 local_2ea;
  allocator local_2e9;
  uint32_t cluster_size_4;
  undefined1 local_2c2;
  allocator local_2c1;
  string local_2c0 [32];
  Scope local_2a0;
  undefined1 local_29a;
  allocator local_299;
  GroupOperation operation_5;
  undefined1 local_272;
  allocator local_271;
  string local_270 [36];
  uint32_t local_24c;
  Scope local_248;
  uint32_t cluster_size_3;
  GroupOperation operation_4;
  undefined1 local_21a;
  allocator local_219;
  string local_218 [36];
  uint32_t local_1f4;
  Scope local_1f0;
  uint32_t cluster_size_2;
  GroupOperation operation_3;
  undefined1 local_1c2;
  allocator local_1c1;
  string local_1c0 [36];
  uint32_t local_19c;
  Scope local_198;
  uint32_t cluster_size_1;
  GroupOperation operation_2;
  undefined1 local_16a;
  allocator local_169;
  string local_168 [36];
  uint32_t local_144;
  Scope local_140;
  uint32_t cluster_size;
  GroupOperation operation_1;
  Scope local_118;
  allocator local_111;
  GroupOperation operation;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8 [32];
  uint32_t local_c8;
  Scope local_c4;
  Scope scope;
  uint32_t id;
  uint32_t result_type;
  undefined1 local_92;
  allocator local_91;
  string local_90 [36];
  BaseType local_6c;
  BaseType local_68;
  BaseType uint_type;
  BaseType int_type;
  uint32_t integer_width;
  allocator local_49;
  string local_48 [36];
  uint local_24;
  Scope *pSStack_20;
  Op op;
  uint32_t *ops;
  Instruction *i_local;
  CompilerMSL *this_local;
  
  ops = (uint32_t *)i;
  i_local = (Instruction *)this;
  pSStack_20 = Compiler::stream((Compiler *)this,i);
  local_24 = (uint)(ushort)*ops;
  bVar3 = Options::supports_msl_version(&this->msl_options,2,0,0);
  if (!bVar3) {
    int_type._3_1_ = 1;
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_48,"Subgroups are only supported in Metal 2.0 and up.",&local_49);
    CompilerError::CompilerError(pCVar5,(string *)local_48);
    int_type._3_1_ = Unknown >> 0x18;
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  uint_type = CompilerGLSL::get_integer_width_for_instruction
                        (&this->super_CompilerGLSL,(Instruction *)ops);
  local_68 = to_signed_basetype(uint_type);
  local_6c = to_unsigned_basetype(uint_type);
  bVar3 = Options::is_ios(&this->msl_options);
  if ((((bVar3) && (local_24 != 0x151)) && (3 < local_24 - 0x159)) && (1 < local_24 - 0x16d)) {
    local_92 = 1;
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_90,"iOS only supports quad-group operations.",&local_91);
    CompilerError::CompilerError(pCVar5,(string *)local_90);
    local_92 = 0;
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  bVar3 = Options::is_macos(&this->msl_options);
  if (((bVar3) && (bVar3 = Options::supports_msl_version(&this->msl_options,2,1,0), !bVar3)) &&
     ((local_24 != 0x151 && (3 < local_24 - 0x159)))) {
    id._2_1_ = 1;
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&result_type,
               "Subgroup ops beyond broadcast and shuffle on macOS require Metal 2.1 and up.",
               (allocator *)((long)&id + 3));
    CompilerError::CompilerError(pCVar5,(string *)&result_type);
    id._2_1_ = 0;
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  scope = *pSStack_20;
  local_c4 = pSStack_20[1];
  local_c8 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[2]);
  result_type_00 = scope;
  result_id = local_c4;
  if (local_c8 != 3) {
    local_ea = 1;
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_e8,"Only subgroup scope is supported.",&local_e9);
    CompilerError::CompilerError(pCVar5,(string *)local_e8);
    local_ea = 0;
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  switch(local_24) {
  case 0x14d:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&operation,"simd_is_first()",&local_111);
    CompilerGLSL::emit_op
              (&this->super_CompilerGLSL,result_type_00,result_id,(string *)&operation,true,false);
    ::std::__cxx11::string::~string((string *)&operation);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_111);
    break;
  case 0x14e:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[3],"simd_all");
    break;
  case 0x14f:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[3],"simd_any");
    break;
  case 0x150:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[3],"spvSubgroupAllEqual");
    break;
  case 0x151:
    SVar1 = pSStack_20[3];
    SVar2 = pSStack_20[4];
    bVar3 = Options::is_ios(&this->msl_options);
    if (bVar3) {
      local_ae0 = "quad_broadcast";
    }
    else {
      local_ae0 = "simd_broadcast";
    }
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,result_type_00,result_id,SVar1,SVar2,local_ae0);
    break;
  case 0x152:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[3],"simd_broadcast_first");
    break;
  case 0x153:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[3],"spvSubgroupBallot");
    break;
  case 0x154:
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[3],
               this->builtin_subgroup_invocation_id_id,"spvSubgroupBallotBitExtract");
    break;
  case 0x155:
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[3],pSStack_20[4],
               "spvSubgroupBallotBitExtract");
    break;
  case 0x156:
    local_118 = pSStack_20[3];
    if (local_118 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"spvSubgroupBallotBitCount")
      ;
    }
    else if (local_118 == ScopeDevice) {
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],
                 this->builtin_subgroup_invocation_id_id,"spvSubgroupBallotInclusiveBitCount");
    }
    else {
      if (local_118 != ScopeWorkgroup) {
        cluster_size._2_1_ = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_1,"Invalid BitCount operation.",
                   (allocator *)((long)&cluster_size + 3));
        CompilerError::CompilerError(pCVar5,(string *)&operation_1);
        cluster_size._2_1_ = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_binary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],
                 this->builtin_subgroup_invocation_id_id,"spvSubgroupBallotExclusiveBitCount");
    }
    break;
  case 0x157:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[3],"spvSubgroupBallotFindLSB");
    break;
  case 0x158:
    CompilerGLSL::emit_unary_func_op
              (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[3],"spvSubgroupBallotFindMSB");
    break;
  case 0x159:
    SVar1 = pSStack_20[3];
    SVar2 = pSStack_20[4];
    bVar3 = Options::is_ios(&this->msl_options);
    if (bVar3) {
      local_b08 = "quad_shuffle";
    }
    else {
      local_b08 = "simd_shuffle";
    }
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,result_type_00,result_id,SVar1,SVar2,local_b08);
    break;
  case 0x15a:
    SVar1 = pSStack_20[3];
    SVar2 = pSStack_20[4];
    bVar3 = Options::is_ios(&this->msl_options);
    if (bVar3) {
      local_b20 = "quad_shuffle_xor";
    }
    else {
      local_b20 = "simd_shuffle_xor";
    }
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,result_type_00,result_id,SVar1,SVar2,local_b20);
    break;
  case 0x15b:
    SVar1 = pSStack_20[3];
    SVar2 = pSStack_20[4];
    bVar3 = Options::is_ios(&this->msl_options);
    if (bVar3) {
      local_b38 = "quad_shuffle_up";
    }
    else {
      local_b38 = "simd_shuffle_up";
    }
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,result_type_00,result_id,SVar1,SVar2,local_b38);
    break;
  case 0x15c:
    SVar1 = pSStack_20[3];
    SVar2 = pSStack_20[4];
    bVar3 = Options::is_ios(&this->msl_options);
    if (bVar3) {
      local_b50 = "quad_shuffle_down";
    }
    else {
      local_b50 = "simd_shuffle_down";
    }
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,result_type_00,result_id,SVar1,SVar2,local_b50);
    break;
  case 0x15d:
    local_1f0 = pSStack_20[3];
    if (local_1f0 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_sum");
    }
    else if (local_1f0 == ScopeDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_prefix_inclusive_sum")
      ;
    }
    else if (local_1f0 == ScopeWorkgroup) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_prefix_exclusive_sum")
      ;
    }
    else {
      if (local_1f0 != ScopeSubgroup) {
        cluster_size_3._2_1_ = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_4,"Invalid group operation.",
                   (allocator *)((long)&cluster_size_3 + 3));
        CompilerError::CompilerError(pCVar5,(string *)&operation_4);
        cluster_size_3._2_1_ = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_1f4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[5]);
      if (local_1f4 != 4) {
        local_21a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_218,"Metal only supports quad ClusteredReduce.",&local_219);
        CompilerError::CompilerError(pCVar5,(string *)local_218);
        local_21a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"quad_sum");
    }
    break;
  case 0x15e:
    local_140 = pSStack_20[3];
    if (local_140 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_sum");
    }
    else if (local_140 == ScopeDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_prefix_inclusive_sum")
      ;
    }
    else if (local_140 == ScopeWorkgroup) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_prefix_exclusive_sum")
      ;
    }
    else {
      if (local_140 != ScopeSubgroup) {
        cluster_size_1._2_1_ = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_2,"Invalid group operation.",
                   (allocator *)((long)&cluster_size_1 + 3));
        CompilerError::CompilerError(pCVar5,(string *)&operation_2);
        cluster_size_1._2_1_ = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_144 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[5]);
      if (local_144 != 4) {
        local_16a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_168,"Metal only supports quad ClusteredReduce.",&local_169);
        CompilerError::CompilerError(pCVar5,(string *)local_168);
        local_16a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"quad_sum");
    }
    break;
  case 0x15f:
    local_248 = pSStack_20[3];
    if (local_248 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_product");
    }
    else if (local_248 == ScopeDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],
                 "simd_prefix_inclusive_product");
    }
    else if (local_248 == ScopeWorkgroup) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],
                 "simd_prefix_exclusive_product");
    }
    else {
      if (local_248 != ScopeSubgroup) {
        local_29a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&operation_5,"Invalid group operation.",&local_299)
        ;
        CompilerError::CompilerError(pCVar5,(string *)&operation_5);
        local_29a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_24c = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[5]);
      if (local_24c != 4) {
        local_272 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_270,"Metal only supports quad ClusteredReduce.",&local_271);
        CompilerError::CompilerError(pCVar5,(string *)local_270);
        local_272 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"quad_product");
    }
    break;
  case 0x160:
    local_198 = pSStack_20[3];
    if (local_198 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_product");
    }
    else if (local_198 == ScopeDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],
                 "simd_prefix_inclusive_product");
    }
    else if (local_198 == ScopeWorkgroup) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],
                 "simd_prefix_exclusive_product");
    }
    else {
      if (local_198 != ScopeSubgroup) {
        cluster_size_2._2_1_ = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_3,"Invalid group operation.",
                   (allocator *)((long)&cluster_size_2 + 3));
        CompilerError::CompilerError(pCVar5,(string *)&operation_3);
        cluster_size_2._2_1_ = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_19c = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[5]);
      if (local_19c != 4) {
        local_1c2 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_1c0,"Metal only supports quad ClusteredReduce.",&local_1c1);
        CompilerError::CompilerError(pCVar5,(string *)local_1c0);
        local_1c2 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"quad_product");
    }
    break;
  case 0x161:
    local_3e0 = pSStack_20[3];
    if (local_3e0 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op_cast
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_min",local_68,local_68
                );
    }
    else {
      if (local_3e0 == ScopeDevice) {
        local_402 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_400,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformSMin.",
                   &local_401);
        CompilerError::CompilerError(pCVar5,(string *)local_400);
        local_402 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_3e0 == ScopeWorkgroup) {
        local_42a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&cluster_size_6,
                   "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformSMin.",&local_429);
        CompilerError::CompilerError(pCVar5,(string *)&cluster_size_6);
        local_42a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_3e0 != ScopeSubgroup) {
        local_47a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&operation_8,"Invalid group operation.",&local_479)
        ;
        CompilerError::CompilerError(pCVar5,(string *)&operation_8);
        local_47a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_430 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[5]);
      if (local_430 != 4) {
        local_452 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_450,"Metal only supports quad ClusteredReduce.",&local_451);
        CompilerError::CompilerError(pCVar5,(string *)local_450);
        local_452 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op_cast
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"quad_min",local_68,local_68
                );
    }
    break;
  case 0x162:
    local_520 = pSStack_20[3];
    if (local_520 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op_cast
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_min",local_6c,local_6c
                );
    }
    else {
      if (local_520 == ScopeDevice) {
        local_542 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_540,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformUMin.",
                   &local_541);
        CompilerError::CompilerError(pCVar5,(string *)local_540);
        local_542 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_520 == ScopeWorkgroup) {
        local_56a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&cluster_size_8,
                   "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformUMin.",&local_569);
        CompilerError::CompilerError(pCVar5,(string *)&cluster_size_8);
        local_56a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_520 != ScopeSubgroup) {
        local_5ba = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_10,"Invalid group operation.",&local_5b9);
        CompilerError::CompilerError(pCVar5,(string *)&operation_10);
        local_5ba = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_570 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[5]);
      if (local_570 != 4) {
        local_592 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_590,"Metal only supports quad ClusteredReduce.",&local_591);
        CompilerError::CompilerError(pCVar5,(string *)local_590);
        local_592 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op_cast
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"quad_min",local_6c,local_6c
                );
    }
    break;
  case 0x163:
    local_2a0 = pSStack_20[3];
    if (local_2a0 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_min");
    }
    else {
      if (local_2a0 == ScopeDevice) {
        local_2c2 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_2c0,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformFMin.",
                   &local_2c1);
        CompilerError::CompilerError(pCVar5,(string *)local_2c0);
        local_2c2 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_2a0 == ScopeWorkgroup) {
        local_2ea = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&cluster_size_4,
                   "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformFMin.",&local_2e9);
        CompilerError::CompilerError(pCVar5,(string *)&cluster_size_4);
        local_2ea = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_2a0 != ScopeSubgroup) {
        local_33a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&operation_6,"Invalid group operation.",&local_339)
        ;
        CompilerError::CompilerError(pCVar5,(string *)&operation_6);
        local_33a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_2f0 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[5]);
      if (local_2f0 != 4) {
        local_312 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_310,"Metal only supports quad ClusteredReduce.",&local_311);
        CompilerError::CompilerError(pCVar5,(string *)local_310);
        local_312 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"quad_min");
    }
    break;
  case 0x164:
    local_480 = pSStack_20[3];
    if (local_480 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op_cast
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_max",local_68,local_68
                );
    }
    else {
      if (local_480 == ScopeDevice) {
        local_4a2 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_4a0,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformSMax.",
                   &local_4a1);
        CompilerError::CompilerError(pCVar5,(string *)local_4a0);
        local_4a2 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_480 == ScopeWorkgroup) {
        local_4ca = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&cluster_size_7,
                   "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformSMax.",&local_4c9);
        CompilerError::CompilerError(pCVar5,(string *)&cluster_size_7);
        local_4ca = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_480 != ScopeSubgroup) {
        local_51a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&operation_9,"Invalid group operation.",&local_519)
        ;
        CompilerError::CompilerError(pCVar5,(string *)&operation_9);
        local_51a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_4d0 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[5]);
      if (local_4d0 != 4) {
        local_4f2 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_4f0,"Metal only supports quad ClusteredReduce.",&local_4f1);
        CompilerError::CompilerError(pCVar5,(string *)local_4f0);
        local_4f2 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op_cast
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"quad_max",local_68,local_68
                );
    }
    break;
  case 0x165:
    local_5c0 = pSStack_20[3];
    if (local_5c0 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op_cast
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_max",local_6c,local_6c
                );
    }
    else {
      if (local_5c0 == ScopeDevice) {
        local_5e2 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_5e0,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformUMax.",
                   &local_5e1);
        CompilerError::CompilerError(pCVar5,(string *)local_5e0);
        local_5e2 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_5c0 == ScopeWorkgroup) {
        local_60a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&cluster_size_9,
                   "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformUMax.",&local_609);
        CompilerError::CompilerError(pCVar5,(string *)&cluster_size_9);
        local_60a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_5c0 != ScopeSubgroup) {
        local_65a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_11,"Invalid group operation.",&local_659);
        CompilerError::CompilerError(pCVar5,(string *)&operation_11);
        local_65a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_610 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[5]);
      if (local_610 != 4) {
        local_632 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_630,"Metal only supports quad ClusteredReduce.",&local_631);
        CompilerError::CompilerError(pCVar5,(string *)local_630);
        local_632 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op_cast
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"quad_max",local_6c,local_6c
                );
    }
    break;
  case 0x166:
    local_340 = pSStack_20[3];
    if (local_340 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_max");
    }
    else {
      if (local_340 == ScopeDevice) {
        local_362 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_360,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformFMax.",
                   &local_361);
        CompilerError::CompilerError(pCVar5,(string *)local_360);
        local_362 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_340 == ScopeWorkgroup) {
        local_38a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&cluster_size_5,
                   "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformFMax.",&local_389);
        CompilerError::CompilerError(pCVar5,(string *)&cluster_size_5);
        local_38a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_340 != ScopeSubgroup) {
        local_3da = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&operation_7,"Invalid group operation.",&local_3d9)
        ;
        CompilerError::CompilerError(pCVar5,(string *)&operation_7);
        local_3da = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_390 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[5]);
      if (local_390 != 4) {
        local_3b2 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_3b0,"Metal only supports quad ClusteredReduce.",&local_3b1);
        CompilerError::CompilerError(pCVar5,(string *)local_3b0);
        local_3b2 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"quad_max");
    }
    break;
  case 0x167:
    local_660 = pSStack_20[3];
    if (local_660 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_and");
    }
    else {
      if (local_660 == ScopeDevice) {
        local_682 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_680,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseAnd."
                   ,&local_681);
        CompilerError::CompilerError(pCVar5,(string *)local_680);
        local_682 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_660 == ScopeWorkgroup) {
        local_6aa = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&cluster_size_10,
                   "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseAnd.",
                   &local_6a9);
        CompilerError::CompilerError(pCVar5,(string *)&cluster_size_10);
        local_6aa = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_660 != ScopeSubgroup) {
        local_6fa = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_12,"Invalid group operation.",&local_6f9);
        CompilerError::CompilerError(pCVar5,(string *)&operation_12);
        local_6fa = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_6b0 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[5]);
      if (local_6b0 != 4) {
        local_6d2 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_6d0,"Metal only supports quad ClusteredReduce.",&local_6d1);
        CompilerError::CompilerError(pCVar5,(string *)local_6d0);
        local_6d2 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"quad_and");
    }
    break;
  case 0x168:
    local_700 = pSStack_20[3];
    if (local_700 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_or");
    }
    else {
      if (local_700 == ScopeDevice) {
        local_722 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_720,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseOr.",
                   &local_721);
        CompilerError::CompilerError(pCVar5,(string *)local_720);
        local_722 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_700 == ScopeWorkgroup) {
        local_74a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&cluster_size_11,
                   "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseOr.",&local_749
                  );
        CompilerError::CompilerError(pCVar5,(string *)&cluster_size_11);
        local_74a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_700 != ScopeSubgroup) {
        local_79a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_13,"Invalid group operation.",&local_799);
        CompilerError::CompilerError(pCVar5,(string *)&operation_13);
        local_79a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_750 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[5]);
      if (local_750 != 4) {
        local_772 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_770,"Metal only supports quad ClusteredReduce.",&local_771);
        CompilerError::CompilerError(pCVar5,(string *)local_770);
        local_772 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"quad_or");
    }
    break;
  case 0x169:
    local_7a0 = pSStack_20[3];
    if (local_7a0 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_xor");
    }
    else {
      if (local_7a0 == ScopeDevice) {
        local_7c2 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_7c0,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformBitwiseXor."
                   ,&local_7c1);
        CompilerError::CompilerError(pCVar5,(string *)local_7c0);
        local_7c2 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_7a0 == ScopeWorkgroup) {
        local_7ea = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&cluster_size_12,
                   "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformBitwiseXor.",
                   &local_7e9);
        CompilerError::CompilerError(pCVar5,(string *)&cluster_size_12);
        local_7ea = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_7a0 != ScopeSubgroup) {
        local_83a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_14,"Invalid group operation.",&local_839);
        CompilerError::CompilerError(pCVar5,(string *)&operation_14);
        local_83a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_7f0 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[5]);
      if (local_7f0 != 4) {
        local_812 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_810,"Metal only supports quad ClusteredReduce.",&local_811);
        CompilerError::CompilerError(pCVar5,(string *)local_810);
        local_812 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"quad_xor");
    }
    break;
  case 0x16a:
    local_840 = pSStack_20[3];
    if (local_840 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_and");
    }
    else {
      if (local_840 == ScopeDevice) {
        local_862 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_860,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalAnd."
                   ,&local_861);
        CompilerError::CompilerError(pCVar5,(string *)local_860);
        local_862 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_840 == ScopeWorkgroup) {
        local_88a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&cluster_size_13,
                   "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalAnd.",
                   &local_889);
        CompilerError::CompilerError(pCVar5,(string *)&cluster_size_13);
        local_88a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_840 != ScopeSubgroup) {
        local_8da = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_15,"Invalid group operation.",&local_8d9);
        CompilerError::CompilerError(pCVar5,(string *)&operation_15);
        local_8da = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_890 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[5]);
      if (local_890 != 4) {
        local_8b2 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_8b0,"Metal only supports quad ClusteredReduce.",&local_8b1);
        CompilerError::CompilerError(pCVar5,(string *)local_8b0);
        local_8b2 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"quad_and");
    }
    break;
  case 0x16b:
    local_8e0 = pSStack_20[3];
    if (local_8e0 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_or");
    }
    else {
      if (local_8e0 == ScopeDevice) {
        local_902 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_900,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalOr.",
                   &local_901);
        CompilerError::CompilerError(pCVar5,(string *)local_900);
        local_902 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_8e0 == ScopeWorkgroup) {
        local_92a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&cluster_size_14,
                   "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalOr.",&local_929
                  );
        CompilerError::CompilerError(pCVar5,(string *)&cluster_size_14);
        local_92a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_8e0 != ScopeSubgroup) {
        local_97a = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&operation_16,"Invalid group operation.",&local_979);
        CompilerError::CompilerError(pCVar5,(string *)&operation_16);
        local_97a = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_930 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[5]);
      if (local_930 != 4) {
        local_952 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_950,"Metal only supports quad ClusteredReduce.",&local_951);
        CompilerError::CompilerError(pCVar5,(string *)local_950);
        local_952 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"quad_or");
    }
    break;
  case 0x16c:
    local_980 = pSStack_20[3];
    if (local_980 == ScopeCrossDevice) {
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"simd_xor");
    }
    else {
      if (local_980 == ScopeDevice) {
        local_9a2 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_9a0,"Metal doesn\'t support InclusiveScan for OpGroupNonUniformLogicalXor."
                   ,&local_9a1);
        CompilerError::CompilerError(pCVar5,(string *)local_9a0);
        local_9a2 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_980 == ScopeWorkgroup) {
        local_9ca = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&cluster_size_15,
                   "Metal doesn\'t support ExclusiveScan for OpGroupNonUniformLogicalXor.",
                   &local_9c9);
        CompilerError::CompilerError(pCVar5,(string *)&cluster_size_15);
        local_9ca = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_980 != ScopeSubgroup) {
        mask_id._2_1_ = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&mask,"Invalid group operation.",(allocator *)((long)&mask_id + 3));
        CompilerError::CompilerError(pCVar5,(string *)&mask);
        mask_id._2_1_ = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_9d0 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[5]);
      if (local_9d0 != 4) {
        local_9f2 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_9f0,"Metal only supports quad ClusteredReduce.",&local_9f1);
        CompilerError::CompilerError(pCVar5,(string *)local_9f0);
        local_9f2 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      CompilerGLSL::emit_unary_func_op
                (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[4],"quad_xor");
    }
    break;
  case 0x16d:
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[3],pSStack_20[4],"quad_broadcast"
              );
    break;
  case 0x16e:
    uVar4 = Compiler::evaluate_constant_u32((Compiler *)this,pSStack_20[4]);
    local_a20 = uVar4 + 1;
    uVar4 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    local_a24 = uVar4;
    local_a28 = Compiler::expression_type_id((Compiler *)this,pSStack_20[4]);
    local_a29 = false;
    Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
              ((Compiler *)this,uVar4,&local_a28,&local_a20,&local_a29);
    CompilerGLSL::emit_binary_func_op
              (&this->super_CompilerGLSL,scope,local_c4,pSStack_20[3],local_a24,"quad_shuffle_xor");
    break;
  default:
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_a50,"Invalid opcode for subgroup.",&local_a51);
    CompilerError::CompilerError(pCVar5,(string *)local_a50);
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  CompilerGLSL::register_control_dependent_expression(&this->super_CompilerGLSL,local_c4);
  return;
}

Assistant:

void CompilerMSL::emit_subgroup_op(const Instruction &i)
{
	const uint32_t *ops = stream(i);
	auto op = static_cast<Op>(i.op);

	// Metal 2.0 is required. iOS only supports quad ops. macOS only supports
	// broadcast and shuffle on 10.13 (2.0), with full support in 10.14 (2.1).
	// Note that iOS makes no distinction between a quad-group and a subgroup;
	// all subgroups are quad-groups there.
	if (!msl_options.supports_msl_version(2))
		SPIRV_CROSS_THROW("Subgroups are only supported in Metal 2.0 and up.");

	// If we need to do implicit bitcasts, make sure we do it with the correct type.
	uint32_t integer_width = get_integer_width_for_instruction(i);
	auto int_type = to_signed_basetype(integer_width);
	auto uint_type = to_unsigned_basetype(integer_width);

	if (msl_options.is_ios())
	{
		switch (op)
		{
		default:
			SPIRV_CROSS_THROW("iOS only supports quad-group operations.");
		case OpGroupNonUniformBroadcast:
		case OpGroupNonUniformShuffle:
		case OpGroupNonUniformShuffleXor:
		case OpGroupNonUniformShuffleUp:
		case OpGroupNonUniformShuffleDown:
		case OpGroupNonUniformQuadSwap:
		case OpGroupNonUniformQuadBroadcast:
			break;
		}
	}

	if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 1))
	{
		switch (op)
		{
		default:
			SPIRV_CROSS_THROW("Subgroup ops beyond broadcast and shuffle on macOS require Metal 2.1 and up.");
		case OpGroupNonUniformBroadcast:
		case OpGroupNonUniformShuffle:
		case OpGroupNonUniformShuffleXor:
		case OpGroupNonUniformShuffleUp:
		case OpGroupNonUniformShuffleDown:
			break;
		}
	}

	uint32_t result_type = ops[0];
	uint32_t id = ops[1];

	auto scope = static_cast<Scope>(evaluate_constant_u32(ops[2]));
	if (scope != ScopeSubgroup)
		SPIRV_CROSS_THROW("Only subgroup scope is supported.");

	switch (op)
	{
	case OpGroupNonUniformElect:
		emit_op(result_type, id, "simd_is_first()", true);
		break;

	case OpGroupNonUniformBroadcast:
		emit_binary_func_op(result_type, id, ops[3], ops[4],
		                    msl_options.is_ios() ? "quad_broadcast" : "simd_broadcast");
		break;

	case OpGroupNonUniformBroadcastFirst:
		emit_unary_func_op(result_type, id, ops[3], "simd_broadcast_first");
		break;

	case OpGroupNonUniformBallot:
		emit_unary_func_op(result_type, id, ops[3], "spvSubgroupBallot");
		break;

	case OpGroupNonUniformInverseBallot:
		emit_binary_func_op(result_type, id, ops[3], builtin_subgroup_invocation_id_id, "spvSubgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotBitExtract:
		emit_binary_func_op(result_type, id, ops[3], ops[4], "spvSubgroupBallotBitExtract");
		break;

	case OpGroupNonUniformBallotFindLSB:
		emit_unary_func_op(result_type, id, ops[3], "spvSubgroupBallotFindLSB");
		break;

	case OpGroupNonUniformBallotFindMSB:
		emit_unary_func_op(result_type, id, ops[3], "spvSubgroupBallotFindMSB");
		break;

	case OpGroupNonUniformBallotBitCount:
	{
		auto operation = static_cast<GroupOperation>(ops[3]);
		if (operation == GroupOperationReduce)
			emit_unary_func_op(result_type, id, ops[4], "spvSubgroupBallotBitCount");
		else if (operation == GroupOperationInclusiveScan)
			emit_binary_func_op(result_type, id, ops[4], builtin_subgroup_invocation_id_id,
			                    "spvSubgroupBallotInclusiveBitCount");
		else if (operation == GroupOperationExclusiveScan)
			emit_binary_func_op(result_type, id, ops[4], builtin_subgroup_invocation_id_id,
			                    "spvSubgroupBallotExclusiveBitCount");
		else
			SPIRV_CROSS_THROW("Invalid BitCount operation.");
		break;
	}

	case OpGroupNonUniformShuffle:
		emit_binary_func_op(result_type, id, ops[3], ops[4], msl_options.is_ios() ? "quad_shuffle" : "simd_shuffle");
		break;

	case OpGroupNonUniformShuffleXor:
		emit_binary_func_op(result_type, id, ops[3], ops[4],
		                    msl_options.is_ios() ? "quad_shuffle_xor" : "simd_shuffle_xor");
		break;

	case OpGroupNonUniformShuffleUp:
		emit_binary_func_op(result_type, id, ops[3], ops[4],
		                    msl_options.is_ios() ? "quad_shuffle_up" : "simd_shuffle_up");
		break;

	case OpGroupNonUniformShuffleDown:
		emit_binary_func_op(result_type, id, ops[3], ops[4],
		                    msl_options.is_ios() ? "quad_shuffle_down" : "simd_shuffle_down");
		break;

	case OpGroupNonUniformAll:
		emit_unary_func_op(result_type, id, ops[3], "simd_all");
		break;

	case OpGroupNonUniformAny:
		emit_unary_func_op(result_type, id, ops[3], "simd_any");
		break;

	case OpGroupNonUniformAllEqual:
		emit_unary_func_op(result_type, id, ops[3], "spvSubgroupAllEqual");
		break;

		// clang-format off
#define MSL_GROUP_OP(op, msl_op) \
case OpGroupNonUniform##op: \
	{ \
		auto operation = static_cast<GroupOperation>(ops[3]); \
		if (operation == GroupOperationReduce) \
			emit_unary_func_op(result_type, id, ops[4], "simd_" #msl_op); \
		else if (operation == GroupOperationInclusiveScan) \
			emit_unary_func_op(result_type, id, ops[4], "simd_prefix_inclusive_" #msl_op); \
		else if (operation == GroupOperationExclusiveScan) \
			emit_unary_func_op(result_type, id, ops[4], "simd_prefix_exclusive_" #msl_op); \
		else if (operation == GroupOperationClusteredReduce) \
		{ \
			/* Only cluster sizes of 4 are supported. */ \
			uint32_t cluster_size = evaluate_constant_u32(ops[5]); \
			if (cluster_size != 4) \
				SPIRV_CROSS_THROW("Metal only supports quad ClusteredReduce."); \
			emit_unary_func_op(result_type, id, ops[4], "quad_" #msl_op); \
		} \
		else \
			SPIRV_CROSS_THROW("Invalid group operation."); \
		break; \
	}